

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmemory.h
# Opt level: O0

uint16_t zng_memread_2(void *ptr)

{
  void *ptr_local;
  
  return *ptr;
}

Assistant:

static inline uint16_t zng_memread_2(const void *ptr) {
#if defined(HAVE_MAY_ALIAS)
    typedef struct { uint16_t val; } __attribute__ ((__packed__, __may_alias__)) unaligned_uint16_t;
    return ((const unaligned_uint16_t *)ptr)->val;
#else
    uint16_t val;
    memcpy(&val, ptr, sizeof(val));
    return val;
#endif
}